

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

void __thiscall cmSystemTools::EnvDiff::ApplyToCurrentEnv(EnvDiff *this,ostringstream *measurement)

{
  undefined8 a;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  char *value;
  ostream *poVar2;
  char local_59;
  undefined1 local_58 [8];
  string env_update;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *env_apply;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *__range1;
  ostringstream *measurement_local;
  EnvDiff *this_local;
  
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::begin(&this->diff);
  env_apply = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::end(&this->diff);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&env_apply), bVar1) {
    env_update.field_2._8_8_ =
         std::
         _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator*(&__end1);
    bVar1 = std::optional::operator_cast_to_bool
                      ((optional *)&((reference)env_update.field_2._8_8_)->second);
    a = env_update.field_2._8_8_;
    if (bVar1) {
      local_59 = '=';
      args = std::
             optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)(env_update.field_2._8_8_ + 0x20));
      cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string_const&>
                ((string *)local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)a,&local_59,
                 args);
      cmsys::SystemTools::PutEnv((string *)local_58);
      if (measurement != (ostringstream *)0x0) {
        poVar2 = std::operator<<((ostream *)measurement,(string *)local_58);
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
      std::__cxx11::string::~string((string *)local_58);
    }
    else {
      value = (char *)std::__cxx11::string::c_str();
      UnsetEnv(value);
      if (measurement != (ostringstream *)0x0) {
        poVar2 = std::operator<<((ostream *)measurement,'#');
        poVar2 = std::operator<<(poVar2,(string *)env_update.field_2._8_8_);
        std::operator<<(poVar2,"=\n");
      }
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void cmSystemTools::EnvDiff::ApplyToCurrentEnv(std::ostringstream* measurement)
{
  for (auto const& env_apply : diff) {
    if (env_apply.second) {
      auto const env_update =
        cmStrCat(env_apply.first, '=', *env_apply.second);
      cmSystemTools::PutEnv(env_update);
      if (measurement) {
        *measurement << env_update << std::endl;
      }
    } else {
      cmSystemTools::UnsetEnv(env_apply.first.c_str());
      if (measurement) {
        // Signify that this variable is being actively unset
        *measurement << '#' << env_apply.first << "=\n";
      }
    }
  }
}